

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t DSTcorrect(time_t Start,time_t Future)

{
  int iVar1;
  tm *ptVar2;
  undefined1 local_68 [8];
  tm_conflict1 tmbuf;
  tm_conflict1 *ltime;
  time_t FutureDay;
  time_t StartDay;
  time_t Future_local;
  time_t Start_local;
  
  StartDay = Future;
  Future_local = Start;
  tmbuf.tm_zone = (char *)localtime_r(&Future_local,(tm *)local_68);
  iVar1 = ((tm *)tmbuf.tm_zone)->tm_hour;
  ptVar2 = localtime_r(&StartDay,(tm *)local_68);
  return (StartDay - Future_local) +
         ((long)((iVar1 + 1) % 0x18) - (long)((ptVar2->tm_hour + 1) % 0x18)) * 0xe10;
}

Assistant:

static time_t
DSTcorrect(time_t Start, time_t Future)
{
	time_t		StartDay;
	time_t		FutureDay;
	struct tm	*ltime;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE__LOCALTIME64_S)
	struct tm	tmbuf;
#endif
#if defined(HAVE__LOCALTIME64_S)
	errno_t		terr;
	__time64_t	tmptime;
#endif

#if defined(HAVE_LOCALTIME_R)
	ltime = localtime_r(&Start, &tmbuf);
#elif defined(HAVE__LOCALTIME64_S)
	tmptime = Start;
	terr = _localtime64_s(&tmbuf, &tmptime);
	if (terr)
		ltime = NULL;
	else
		ltime = &tmbuf;
#else
	ltime = localtime(&Start);
#endif
	StartDay = (ltime->tm_hour + 1) % 24;
#if defined(HAVE_LOCALTIME_R)
	ltime = localtime_r(&Future, &tmbuf);
#elif defined(HAVE__LOCALTIME64_S)
	tmptime = Future;
	terr = _localtime64_s(&tmbuf, &tmptime);
	if (terr)
		ltime = NULL;
	else
		ltime = &tmbuf;
#else
	ltime = localtime(&Future);
#endif
	FutureDay = (ltime->tm_hour + 1) % 24;
	return (Future - Start) + (StartDay - FutureDay) * HOUR;
}